

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

Promise<unsigned_long> __thiscall kj::anon_unknown_123::AsyncPump::pump(AsyncPump *this)

{
  undefined8 *in_RSI;
  Promise<unsigned_long> local_38;
  unsigned_long local_30;
  unsigned_long local_28;
  WiderType<Decay<unsigned_long>,_Decay<unsigned_long>_> local_20;
  uint64_t n;
  AsyncPump *this_local;
  
  local_28 = in_RSI[2] - in_RSI[3];
  local_30 = 0x1000;
  this_local = this;
  local_20 = min<unsigned_long,unsigned_long>(&local_28,&local_30);
  if (local_20 == 0) {
    Promise<unsigned_long>::Promise((Promise<unsigned_long> *)this,in_RSI[3]);
  }
  else {
    (**(code **)(*(long *)*in_RSI + 8))(&local_38,(long *)*in_RSI,in_RSI + 4,1,local_20);
    Promise<unsigned_long>::
    then<kj::(anonymous_namespace)::AsyncPump::pump()::_lambda(unsigned_long)_1_>
              ((Promise<unsigned_long> *)this,(Type *)&local_38);
    Promise<unsigned_long>::~Promise(&local_38);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<uint64_t> pump() {
    // TODO(perf): This could be more efficient by reading half a buffer at a time and then
    //   starting the next read concurrent with writing the data from the previous read.

    uint64_t n = kj::min(limit - doneSoFar, sizeof(buffer));
    if (n == 0) return doneSoFar;

    return input.tryRead(buffer, 1, n)
        .then([this](size_t amount) -> Promise<uint64_t> {
      if (amount == 0) return doneSoFar;  // EOF
      doneSoFar += amount;
      return output.write(arrayPtr(buffer).first(amount)).then([this]() {
        return pump();
      });
    });
  }